

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Buffer::DeleteFile(Buffer *this,string *filename)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  reference piVar4;
  char *__filename;
  ostream *poVar5;
  const_iterator local_48;
  _List_node_base *local_40;
  _Self local_38;
  _List_node_base *local_30;
  _List_iterator<int> local_28;
  iterator it;
  int pos;
  string *filename_local;
  Buffer *this_local;
  
  std::_List_iterator<int>::_List_iterator(&local_28);
  local_30 = (_List_node_base *)
             std::__cxx11::list<int,_std::allocator<int>_>::begin(&this->Occupy_Block);
  local_28._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)std::__cxx11::list<int,_std::allocator<int>_>::end(&this->Occupy_Block);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    piVar4 = std::_List_iterator<int>::operator*(&local_28);
    _Var2 = std::operator==(&this->buffer[*piVar4].FileName,filename);
    if (_Var2) {
      piVar4 = std::_List_iterator<int>::operator*(&local_28);
      it._M_node._4_4_ = *piVar4;
      Block::BlockClear(this->buffer + it._M_node._4_4_);
      UnDirt(this,it._M_node._4_4_);
      UnLock(this,it._M_node._4_4_);
      std::_List_const_iterator<int>::_List_const_iterator(&local_48,&local_28);
      local_40 = (_List_node_base *)
                 std::__cxx11::list<int,_std::allocator<int>_>::erase(&this->Occupy_Block,local_48);
      local_28._M_node = local_40;
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                (&this->Empty_Block,(value_type_conflict *)((long)&it._M_node + 4));
    }
    else {
      std::_List_iterator<int>::operator++(&local_28,0);
    }
  }
  __filename = (char *)std::__cxx11::string::c_str();
  iVar3 = remove(__filename);
  if (iVar3 == 0) {
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Delete file ");
  poVar5 = std::operator<<(poVar5,(string *)filename);
  poVar5 = std::operator<<(poVar5," failed!");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  system("pause");
  exit(1);
}

Assistant:

void Buffer::DeleteFile(string filename) {
	int pos;
	list<int>::iterator it;
 	for (it = this->Occupy_Block.begin(); it != this->Occupy_Block.end();) {
		if (this->buffer[*it].FileName == filename) {
			pos = *it;
			this->buffer[pos].BlockClear();				//�����ļ���buffer�еĿ�ȫ�����
			this->UnDirt(pos);
			this->UnLock(pos);
			it = this->Occupy_Block.erase(it);
			this->Empty_Block.push_back(pos);
		}
		else {
			it++;
		}
	}
	if (remove(filename.c_str()) != 0) {
		cout << "Delete file " << filename << " failed!" << endl;
		system("pause");
		exit(1);
	}
}